

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadEXRFromMemory(float **out_rgba,int *width,int *height,uchar *memory,size_t size,char **err)

{
  long lVar1;
  int iVar2;
  ostream *poVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong local_548;
  size_t i_4;
  size_t pixel_size_1;
  uchar **src_1;
  size_t srcIdx_1;
  size_t idx_1;
  size_t jj_1;
  size_t ii_1;
  size_t i_3;
  size_t j_1;
  int it_1;
  size_t tile_size_y_1;
  size_t tile_size_x_1;
  string local_4e0;
  allocator local_4b9;
  string local_4b8;
  allocator local_491;
  string local_490;
  undefined4 local_46c;
  ulong uStack_468;
  float val;
  size_t i_2;
  size_t pixel_size;
  uchar **src;
  size_t srcIdx;
  size_t idx;
  size_t jj;
  size_t ii;
  size_t i_1;
  size_t j;
  ulong uStack_418;
  int it;
  size_t tile_size_y;
  size_t tile_size_x;
  int c;
  int idxA;
  int idxB;
  int idxG;
  int idxR;
  int i;
  stringstream local_3d0 [8];
  stringstream ss;
  ostream local_3c0 [380];
  int local_244;
  undefined1 local_240 [4];
  int ret;
  EXRHeader exr_header;
  EXRImage exr_image;
  EXRVersion exr_version;
  allocator local_61;
  string local_60;
  char **local_40;
  char **err_local;
  size_t size_local;
  uchar *memory_local;
  int *height_local;
  int *width_local;
  float **out_rgba_local;
  
  local_40 = err;
  err_local = (char **)size;
  size_local = (size_t)memory;
  memory_local = (uchar *)height;
  height_local = width;
  width_local = (int *)out_rgba;
  if ((out_rgba == (float **)0x0) || (memory == (uchar *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_60,"Invalid argument for LoadEXRFromMemory",&local_61);
    tinyexr::SetErrorMessage(&local_60,local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    out_rgba_local._4_4_ = -3;
  }
  else {
    InitEXRHeader((EXRHeader *)local_240);
    local_244 = ParseEXRVersionFromMemory
                          ((EXRVersion *)&exr_image.num_channels,(uchar *)size_local,
                           (size_t)err_local);
    if (local_244 == 0) {
      local_244 = ParseEXRHeaderFromMemory
                            ((EXRHeader *)local_240,(EXRVersion *)&exr_image.num_channels,
                             (uchar *)size_local,(size_t)err_local,local_40);
      out_rgba_local._4_4_ = local_244;
      if (local_244 == 0) {
        for (idxG = 0; idxG < (int)exr_header.pixel_types; idxG = idxG + 1) {
          if (*(int *)((exr_header.channels)->name + (long)idxG * 4) == 1) {
            *(undefined4 *)(exr_header._120_8_ + (long)idxG * 4) = 2;
          }
        }
        InitEXRImage((EXRImage *)(exr_header.name + 0xf8));
        out_rgba_local._4_4_ =
             LoadEXRImageFromMemory
                       ((EXRImage *)(exr_header.name + 0xf8),(EXRHeader *)local_240,
                        (uchar *)size_local,(size_t)err_local,local_40);
        if (out_rgba_local._4_4_ == 0) {
          idxB = -1;
          idxA = -1;
          c = -1;
          tile_size_x._4_4_ = -1;
          local_244 = 0;
          for (tile_size_x._0_4_ = 0; (int)tile_size_x < (int)exr_header.pixel_types;
              tile_size_x._0_4_ = (int)tile_size_x + 1) {
            iVar2 = strcmp((exr_header.custom_attributes)->name + (long)(int)tile_size_x * 0x110,"R"
                          );
            if (iVar2 == 0) {
              idxB = (int)tile_size_x;
            }
            else {
              iVar2 = strcmp((exr_header.custom_attributes)->name + (long)(int)tile_size_x * 0x110,
                             "G");
              if (iVar2 == 0) {
                idxA = (int)tile_size_x;
              }
              else {
                iVar2 = strcmp((exr_header.custom_attributes)->name + (long)(int)tile_size_x * 0x110
                               ,"B");
                if (iVar2 == 0) {
                  c = (int)tile_size_x;
                }
                else {
                  iVar2 = strcmp((exr_header.custom_attributes)->name +
                                 (long)(int)tile_size_x * 0x110,"A");
                  if (iVar2 == 0) {
                    tile_size_x._4_4_ = (int)tile_size_x;
                  }
                }
              }
            }
          }
          if ((int)exr_header.pixel_types == 1) {
            pvVar4 = malloc((long)(int)exr_image.images * 0x10 * (long)exr_image.images._4_4_);
            *(void **)width_local = pvVar4;
            if (exr_header.screen_window_width == 0.0) {
              i_2 = (long)(int)exr_image.images * (long)exr_image.images._4_4_;
              for (uStack_468 = 0; uStack_468 < i_2; uStack_468 = uStack_468 + 1) {
                local_46c = *(undefined4 *)(*(long *)exr_image._16_8_ + uStack_468 * 4);
                *(undefined4 *)(*(long *)width_local + uStack_468 * 0x10) = local_46c;
                *(undefined4 *)(*(long *)width_local + 4 + uStack_468 * 0x10) = local_46c;
                *(undefined4 *)(*(long *)width_local + 8 + uStack_468 * 0x10) = local_46c;
                *(undefined4 *)(*(long *)width_local + 0xc + uStack_468 * 0x10) = local_46c;
              }
            }
            else {
              tile_size_y = (size_t)exr_header.chunk_count;
              uStack_418 = (ulong)exr_header.tiled;
              for (j._4_4_ = 0; j._4_4_ < exr_image.height; j._4_4_ = j._4_4_ + 1) {
                for (i_1 = 0; i_1 < uStack_418; i_1 = i_1 + 1) {
                  for (ii = 0; ii < tile_size_y; ii = ii + 1) {
                    jj = (long)*(int *)(exr_header.name._248_8_ + (long)j._4_4_ * 0x20) *
                         tile_size_y + ii;
                    idx = (long)*(int *)(exr_header.name._248_8_ + (long)j._4_4_ * 0x20 + 4) *
                          uStack_418 + i_1;
                    srcIdx = jj + idx * (long)(int)exr_image.images;
                    if ((jj < (ulong)(long)(int)exr_image.images) &&
                       (idx < (ulong)(long)exr_image.images._4_4_)) {
                      src = (uchar **)(ii + i_1 * tile_size_y);
                      pixel_size = *(undefined8 *)
                                    (exr_header.name._248_8_ + (long)j._4_4_ * 0x20 + 0x18);
                      *(undefined4 *)(*(long *)width_local + srcIdx * 0x10) =
                           *(undefined4 *)(*(long *)pixel_size + (long)src * 4);
                      *(undefined4 *)(*(long *)width_local + 4 + srcIdx * 0x10) =
                           *(undefined4 *)(*(long *)pixel_size + (long)src * 4);
                      *(undefined4 *)(*(long *)width_local + 8 + srcIdx * 0x10) =
                           *(undefined4 *)(*(long *)pixel_size + (long)src * 4);
                      *(undefined4 *)(*(long *)width_local + 0xc + srcIdx * 0x10) =
                           *(undefined4 *)(*(long *)pixel_size + (long)src * 4);
                    }
                  }
                }
              }
            }
          }
          else {
            if (idxB == -1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_490,"R channel not found",&local_491);
              tinyexr::SetErrorMessage(&local_490,local_40);
              std::__cxx11::string::~string((string *)&local_490);
              std::allocator<char>::~allocator((allocator<char> *)&local_491);
              return -4;
            }
            if (idxA == -1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_4b8,"G channel not found",&local_4b9);
              tinyexr::SetErrorMessage(&local_4b8,local_40);
              std::__cxx11::string::~string((string *)&local_4b8);
              std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
              return -4;
            }
            if (c == -1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_4e0,"B channel not found",
                         (allocator *)((long)&tile_size_x_1 + 7));
              tinyexr::SetErrorMessage(&local_4e0,local_40);
              std::__cxx11::string::~string((string *)&local_4e0);
              std::allocator<char>::~allocator((allocator<char> *)((long)&tile_size_x_1 + 7));
              return -4;
            }
            pvVar4 = malloc((long)(int)exr_image.images * 0x10 * (long)exr_image.images._4_4_);
            *(void **)width_local = pvVar4;
            if (exr_header.screen_window_width == 0.0) {
              for (local_548 = 0;
                  local_548 < (ulong)((long)(int)exr_image.images * (long)exr_image.images._4_4_);
                  local_548 = local_548 + 1) {
                *(undefined4 *)(*(long *)width_local + local_548 * 0x10) =
                     *(undefined4 *)(*(long *)(exr_image._16_8_ + (long)idxB * 8) + local_548 * 4);
                *(undefined4 *)(*(long *)width_local + 4 + local_548 * 0x10) =
                     *(undefined4 *)(*(long *)(exr_image._16_8_ + (long)idxA * 8) + local_548 * 4);
                *(undefined4 *)(*(long *)width_local + 8 + local_548 * 0x10) =
                     *(undefined4 *)(*(long *)(exr_image._16_8_ + (long)c * 8) + local_548 * 4);
                if (tile_size_x._4_4_ == -1) {
                  *(undefined4 *)(*(long *)width_local + 0xc + local_548 * 0x10) = 0x3f800000;
                }
                else {
                  *(undefined4 *)(*(long *)width_local + 0xc + local_548 * 0x10) =
                       *(undefined4 *)
                        (*(long *)(exr_image._16_8_ + (long)tile_size_x._4_4_ * 8) + local_548 * 4);
                }
              }
            }
            else {
              uVar5 = (ulong)exr_header.chunk_count;
              for (j_1._4_4_ = 0; j_1._4_4_ < exr_image.height; j_1._4_4_ = j_1._4_4_ + 1) {
                for (i_3 = 0; i_3 < (ulong)(long)exr_header.tiled; i_3 = i_3 + 1) {
                  for (ii_1 = 0; ii_1 < uVar5; ii_1 = ii_1 + 1) {
                    uVar6 = (long)*(int *)(exr_header.name._248_8_ + (long)j_1._4_4_ * 0x20) * uVar5
                            + ii_1;
                    uVar7 = (long)*(int *)(exr_header.name._248_8_ + (long)j_1._4_4_ * 0x20 + 4) *
                            (long)exr_header.tiled + i_3;
                    lVar8 = uVar6 + uVar7 * (long)(int)exr_image.images;
                    if ((uVar6 < (ulong)(long)(int)exr_image.images) &&
                       (uVar7 < (ulong)(long)exr_image.images._4_4_)) {
                      lVar9 = ii_1 + i_3 * uVar5;
                      lVar1 = *(long *)(exr_header.name._248_8_ + (long)j_1._4_4_ * 0x20 + 0x18);
                      *(undefined4 *)(*(long *)width_local + lVar8 * 0x10) =
                           *(undefined4 *)(*(long *)(lVar1 + (long)idxB * 8) + lVar9 * 4);
                      *(undefined4 *)(*(long *)width_local + 4 + lVar8 * 0x10) =
                           *(undefined4 *)(*(long *)(lVar1 + (long)idxA * 8) + lVar9 * 4);
                      *(undefined4 *)(*(long *)width_local + 8 + lVar8 * 0x10) =
                           *(undefined4 *)(*(long *)(lVar1 + (long)c * 8) + lVar9 * 4);
                      if (tile_size_x._4_4_ == -1) {
                        *(undefined4 *)(*(long *)width_local + 0xc + lVar8 * 0x10) = 0x3f800000;
                      }
                      else {
                        *(undefined4 *)(*(long *)width_local + 0xc + lVar8 * 0x10) =
                             *(undefined4 *)
                              (*(long *)(lVar1 + (long)tile_size_x._4_4_ * 8) + lVar9 * 4);
                      }
                    }
                  }
                }
              }
            }
          }
          *height_local = (int)exr_image.images;
          *(int *)memory_local = exr_image.images._4_4_;
          FreeEXRHeader((EXRHeader *)local_240);
          FreeEXRImage((EXRImage *)(exr_header.name + 0xf8));
          out_rgba_local._4_4_ = 0;
        }
      }
    }
    else {
      std::__cxx11::stringstream::stringstream(local_3d0);
      poVar3 = std::operator<<(local_3c0,"Failed to parse EXR version. code(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_244);
      std::operator<<(poVar3,")");
      std::__cxx11::stringstream::str();
      tinyexr::SetErrorMessage((string *)&idxR,local_40);
      std::__cxx11::string::~string((string *)&idxR);
      out_rgba_local._4_4_ = local_244;
      std::__cxx11::stringstream::~stringstream(local_3d0);
    }
  }
  return out_rgba_local._4_4_;
}

Assistant:

int LoadEXRFromMemory(float **out_rgba, int *width, int *height,
                      const unsigned char *memory, size_t size,
                      const char **err) {
  if (out_rgba == NULL || memory == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXRFromMemory", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;

  InitEXRHeader(&exr_header);

  int ret = ParseEXRVersionFromMemory(&exr_version, memory, size);
  if (ret != TINYEXR_SUCCESS) {
    std::stringstream ss;
    ss << "Failed to parse EXR version. code(" << ret << ")";
    tinyexr::SetErrorMessage(ss.str(), err);
    return ret;
  }

  ret = ParseEXRHeaderFromMemory(&exr_header, &exr_version, memory, size, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  InitEXRImage(&exr_image);
  ret = LoadEXRImageFromMemory(&exr_image, &exr_header, memory, size, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exr_header.num_channels; c++) {
    if (strcmp(exr_header.channels[c].name, "R") == 0) {
      idxR = c;
    } else if (strcmp(exr_header.channels[c].name, "G") == 0) {
      idxG = c;
    } else if (strcmp(exr_header.channels[c].name, "B") == 0) {
      idxB = c;
    } else if (strcmp(exr_header.channels[c].name, "A") == 0) {
      idxA = c;
    }
  }

  // TODO(syoyo): Refactor removing same code as used in LoadEXR().
  if (exr_header.num_channels == 1) {
    // Grayscale channel only.

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      const size_t tile_size_x = static_cast<size_t>(exr_header.tile_size_x);
      const size_t tile_size_y = static_cast<size_t>(exr_header.tile_size_y);
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (size_t j = 0; j < tile_size_y; j++) {
          for (size_t i = 0; i < tile_size_x; i++) {
            const size_t ii =
                static_cast<size_t>(exr_image.tiles[it].offset_x) *
                    tile_size_x +
                i;
            const size_t jj =
                static_cast<size_t>(exr_image.tiles[it].offset_y) *
                    tile_size_y +
                j;
            const size_t idx = ii + jj * static_cast<size_t>(exr_image.width);

            // out of region check.
            if (ii >= static_cast<size_t>(exr_image.width)) {
              continue;
            }
            if (jj >= static_cast<size_t>(exr_image.height)) {
              continue;
            }
            const size_t srcIdx = i + j * tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 3] =
                reinterpret_cast<float **>(src)[0][srcIdx];
          }
        }
      }
    } else {
      const size_t pixel_size = static_cast<size_t>(exr_image.width) *
        static_cast<size_t>(exr_image.height);
      for (size_t i = 0; i < pixel_size; i++) {
        const float val = reinterpret_cast<float **>(exr_image.images)[0][i];
        (*out_rgba)[4 * i + 0] = val;
        (*out_rgba)[4 * i + 1] = val;
        (*out_rgba)[4 * i + 2] = val;
        (*out_rgba)[4 * i + 3] = val;
      }
    }

  } else {
    // TODO(syoyo): Support non RGBA image.

    if (idxR == -1) {
      tinyexr::SetErrorMessage("R channel not found", err);

      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxG == -1) {
      tinyexr::SetErrorMessage("G channel not found", err);
      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxB == -1) {
      tinyexr::SetErrorMessage("B channel not found", err);
      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      const size_t tile_size_x = static_cast<size_t>(exr_header.tile_size_x);
      const size_t tile_size_y = static_cast<size_t>(exr_header.tile_size_y);
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (size_t j = 0; j < tile_size_y; j++)
          for (size_t i = 0; i < tile_size_x; i++) {
            const size_t ii =
                static_cast<size_t>(exr_image.tiles[it].offset_x) *
                    tile_size_x +
                i;
            const size_t jj =
                static_cast<size_t>(exr_image.tiles[it].offset_y) *
                    tile_size_y +
                j;
            const size_t idx = ii + jj * static_cast<size_t>(exr_image.width);

            // out of region check.
            if (ii >= static_cast<size_t>(exr_image.width)) {
              continue;
            }
            if (jj >= static_cast<size_t>(exr_image.height)) {
              continue;
            }
            const size_t srcIdx = i + j * tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[idxR][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[idxG][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[idxB][srcIdx];
            if (idxA != -1) {
              (*out_rgba)[4 * idx + 3] =
                  reinterpret_cast<float **>(src)[idxA][srcIdx];
            } else {
              (*out_rgba)[4 * idx + 3] = 1.0;
            }
          }
      }
    } else {
      const size_t pixel_size = static_cast<size_t>(exr_image.width) *
        static_cast<size_t>(exr_image.height);
      for (size_t i = 0; i < pixel_size; i++) {
        (*out_rgba)[4 * i + 0] =
            reinterpret_cast<float **>(exr_image.images)[idxR][i];
        (*out_rgba)[4 * i + 1] =
            reinterpret_cast<float **>(exr_image.images)[idxG][i];
        (*out_rgba)[4 * i + 2] =
            reinterpret_cast<float **>(exr_image.images)[idxB][i];
        if (idxA != -1) {
          (*out_rgba)[4 * i + 3] =
              reinterpret_cast<float **>(exr_image.images)[idxA][i];
        } else {
          (*out_rgba)[4 * i + 3] = 1.0;
        }
      }
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);

  return TINYEXR_SUCCESS;
}